

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O0

int do_play_instrument(obj *instr)

{
  bool bVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char acStack_141 [5];
  boolean bStack_13c;
  boolean bStack_13b;
  boolean bStack_13a;
  boolean matched [5];
  int gears;
  int tumblers;
  int iStack_12c;
  boolean ok;
  int y;
  int x;
  char *s;
  char local_118 [7];
  char c;
  char buf [256];
  obj *instr_local;
  
  s._7_1_ = 'y';
  buf._248_8_ = instr;
  if (((byte)u._1052_1_ >> 1 & 1) == 0) {
    if ((instr->otyp != 0x106) && (instr->otyp != 0x107)) {
      s._7_1_ = yn_function("Improvise?","yn",'n');
    }
    if (s._7_1_ == 'n') {
      if ((((ushort)u.uevent._0_2_ >> 6 & 3) == 2) &&
         (cVar2 = yn_function("Play the passtune?","yn",'n'), cVar2 == 'y')) {
        strcpy(local_118,tune);
      }
      else {
        getlin("What tune are you playing? [5 notes, A-G]",local_118);
        mungspaces(local_118);
        for (_y = local_118; *_y != '\0'; _y = _y + 1) {
          cVar2 = highc(*_y);
          *_y = cVar2;
          if (*_y == 'H') {
            *_y = 'B';
          }
        }
      }
      pcVar5 = xname((obj *)buf._248_8_);
      pcVar5 = the(pcVar5);
      pline("You extract a strange sound from %s!",pcVar5);
      bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
      if (bVar3 != '\0') {
        exercise(2,'\x01');
        iVar4 = strcmp(local_118,tune);
        if (iVar4 == 0) {
          for (tumblers = u.uy + -1; tumblers <= u.uy + 1; tumblers = tumblers + 1) {
            for (iStack_12c = u.ux + -1; iStack_12c <= u.ux + 1; iStack_12c = iStack_12c + 1) {
              if ((((0 < iStack_12c) && (iStack_12c < 0x50)) && (-1 < tumblers)) &&
                 ((tumblers < 0x15 &&
                  (bVar3 = find_drawbridge(&stack0xfffffffffffffed4,&tumblers), bVar3 != '\0')))) {
                u.uevent._0_2_ = u.uevent._0_2_ & 0xff3f | 0x80;
                if (level->locations[iStack_12c][tumblers].typ == '$') {
                  close_drawbridge(iStack_12c,tumblers);
                }
                else {
                  open_drawbridge(iStack_12c,tumblers);
                }
                return 1;
              }
            }
          }
        }
        else if (flags.soundok != '\0') {
          if (((ushort)u.uevent._0_2_ >> 6 & 3) == 0) {
            u.uevent._0_2_ = u.uevent._0_2_ & 0xff3f | 0x40;
          }
          bVar1 = false;
          for (tumblers = u.uy + -1; tumblers <= u.uy + 1 && !bVar1; tumblers = tumblers + 1) {
            for (iStack_12c = u.ux + -1; iStack_12c <= u.ux + 1 && !bVar1;
                iStack_12c = iStack_12c + 1) {
              if ((((0 < iStack_12c) && (iStack_12c < 0x50)) && (-1 < tumblers)) &&
                 ((tumblers < 0x15 &&
                  (((level->locations[iStack_12c][tumblers].typ == '\x14' ||
                    (level->locations[iStack_12c][tumblers].typ == '$')) ||
                   (iVar4 = is_drawbridge_wall(iStack_12c,tumblers), -1 < iVar4)))))) {
                bVar1 = true;
              }
            }
          }
          if (bVar1) {
            bStack_13c = '\0';
            bStack_13b = '\0';
            bStack_13a = '\0';
            matched[0] = '\0';
            matched[1] = '\0';
            matched[2] = '\0';
            matched[3] = '\0';
            matched[4] = '\0';
            for (iStack_12c = 0; iStack_12c < 5; iStack_12c = iStack_12c + 1) {
              acStack_141[iStack_12c] = '\0';
            }
            for (iStack_12c = 0; iVar4 = iStack_12c, sVar6 = strlen(local_118), iVar4 < (int)sVar6;
                iStack_12c = iStack_12c + 1) {
              if (iStack_12c < 5) {
                if (local_118[iStack_12c] == tune[iStack_12c]) {
                  _bStack_13c = _bStack_13c + 1;
                  acStack_141[iStack_12c] = '\x01';
                }
                else {
                  for (tumblers = 0; tumblers < 5; tumblers = tumblers + 1) {
                    if (((acStack_141[tumblers] == '\0') &&
                        (local_118[iStack_12c] == tune[tumblers])) &&
                       (local_118[tumblers] != tune[tumblers])) {
                      matched._1_4_ = matched._1_4_ + 1;
                      acStack_141[tumblers] = '\x01';
                      break;
                    }
                  }
                }
              }
            }
            if (matched._1_4_ == 0) {
              if (_bStack_13c != 0) {
                pcVar5 = "s";
                if (_bStack_13c == 1) {
                  pcVar5 = "";
                }
                You_hear("%d gear%s turn.",(ulong)_bStack_13c,pcVar5);
                if (_bStack_13c == 5) {
                  u.uevent._0_2_ = u.uevent._0_2_ & 0xff3f | 0x80;
                }
              }
            }
            else if (_bStack_13c == 0) {
              pcVar5 = "s";
              if (matched._1_4_ == 1) {
                pcVar5 = "";
              }
              You_hear("%d tumbler%s click.",(ulong)(uint)matched._1_4_,pcVar5);
            }
            else {
              pcVar5 = "s";
              if (matched._1_4_ == 1) {
                pcVar5 = "";
              }
              pcVar7 = "s";
              if (_bStack_13c == 1) {
                pcVar7 = "";
              }
              You_hear("%d tumbler%s click and %d gear%s turn.",(ulong)(uint)matched._1_4_,pcVar5,
                       (ulong)_bStack_13c,pcVar7);
            }
          }
        }
      }
      instr_local._4_4_ = 1;
    }
    else {
      instr_local._4_4_ = do_improvisation((obj *)buf._248_8_);
    }
  }
  else {
    pline("You can\'t play music underwater!");
    instr_local._4_4_ = 0;
  }
  return instr_local._4_4_;
}

Assistant:

int do_play_instrument(struct obj *instr)
{
    char buf[BUFSZ], c = 'y';
    char *s;
    int x,y;
    boolean ok;

    if (Underwater) {
	pline("You can't play music underwater!");
	return 0;
    }
    if (instr->otyp != LEATHER_DRUM && instr->otyp != DRUM_OF_EARTHQUAKE) {
	c = yn("Improvise?");
    }
    if (c == 'n') {
	if (u.uevent.uheard_tune == 2 && yn("Play the passtune?") == 'y') {
	    strcpy(buf, tune);
	} else {
	    getlin("What tune are you playing? [5 notes, A-G]", buf);
	    mungspaces(buf);
	    /* convert to uppercase and change any "H" to the expected "B" */
	    for (s = buf; *s; s++) {
		*s = highc(*s);
		if (*s == 'H') *s = 'B';
	    }
	}
	pline("You extract a strange sound from %s!", the(xname(instr)));
	
	/* Check if there was the Stronghold drawbridge near
	 * and if the tune conforms to what we're waiting for.
	 */
	if (Is_stronghold(&u.uz)) {
	    exercise(A_WIS, TRUE);		/* just for trying */
	    if (!strcmp(buf,tune)) {
		/* Search for the drawbridge */
		for (y=u.uy-1; y<=u.uy+1; y++)
		    for (x=u.ux-1;x<=u.ux+1;x++)
			if (isok(x,y))
			if (find_drawbridge(&x,&y)) {
			    u.uevent.uheard_tune = 2; /* tune now fully known */
			    if (level->locations[x][y].typ == DRAWBRIDGE_DOWN)
				close_drawbridge(x,y);
			    else
				open_drawbridge(x,y);
			    return 1;
			}
	    } else if (flags.soundok) {
		if (u.uevent.uheard_tune < 1) u.uevent.uheard_tune = 1;
		/* Okay, it wasn't the right tune, but perhaps
		 * we can give the player some hints like in the
		 * Mastermind game */
		ok = FALSE;
		for (y = u.uy-1; y <= u.uy+1 && !ok; y++)
		    for (x = u.ux-1; x <= u.ux+1 && !ok; x++)
			if (isok(x,y))
			if (IS_DRAWBRIDGE(level->locations[x][y].typ) ||
			   is_drawbridge_wall(x,y) >= 0)
				ok = TRUE;
		if (ok) { /* There is a drawbridge near */
		    int tumblers, gears;
		    boolean matched[5];

		    tumblers = gears = 0;
		    for (x=0; x < 5; x++)
			matched[x] = FALSE;

		    for (x=0; x < (int)strlen(buf); x++)
			if (x < 5) {
			    if (buf[x] == tune[x]) {
				gears++;
				matched[x] = TRUE;
			    } else
				for (y=0; y < 5; y++)
				    if (!matched[y] &&
				       buf[x] == tune[y] &&
				       buf[y] != tune[y]) {
					tumblers++;
					matched[y] = TRUE;
					break;
				    }
			}
		    if (tumblers)
			if (gears)
			    You_hear("%d tumbler%s click and %d gear%s turn.",
				tumblers, plur(tumblers), gears, plur(gears));
			else
			    You_hear("%d tumbler%s click.",
				tumblers, plur(tumblers));
		    else if (gears) {
			You_hear("%d gear%s turn.", gears, plur(gears));
			/* could only get `gears == 5' by playing five
			   correct notes followed by excess; otherwise,
			   tune would have matched above */
			if (gears == 5) u.uevent.uheard_tune = 2;
		    }
		}
	    }
	  }
	return 1;
    } else
	    return do_improvisation(instr);
}